

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::DvpValidateCommittedShaderResources(DeviceContextGLImpl *this)

{
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if ((this->m_BindInfo).super_CommittedShaderResources.ResourcesValidated == false) {
    local_28 = 0;
    uStack_20 = 0;
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    DeviceContextBase<Diligent::EngineGLImplTraits>::DvpVerifySRBCompatibility
              (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>,
               &(this->m_BindInfo).super_CommittedShaderResources,
               (function<Diligent::PipelineResourceSignatureGLImpl_*(unsigned_int)> *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    PipelineStateGLImpl::DvpVerifySRBResources
              ((this->super_DeviceContextBase<Diligent::EngineGLImplTraits>).m_pPipelineState.
               m_pObject,(ShaderResourceCacheArrayType *)&this->m_BindInfo,
               (BaseBindingsArrayType *)
               &(this->m_BindInfo).super_CommittedShaderResources.field_0xe4);
    (this->m_BindInfo).super_CommittedShaderResources.ResourcesValidated = true;
  }
  return;
}

Assistant:

void DeviceContextGLImpl::DvpValidateCommittedShaderResources()
{
    if (m_BindInfo.ResourcesValidated)
        return;

    DvpVerifySRBCompatibility(m_BindInfo);

    m_pPipelineState->DvpVerifySRBResources(m_BindInfo.ResourceCaches, m_BindInfo.BaseBindings);
    m_BindInfo.ResourcesValidated = true;
}